

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall QtMWidgets::DateTimePicker::setDateRange(DateTimePicker *this,QDate *min,QDate *max)

{
  QDate *pQVar1;
  bool bVar2;
  uint uVar3;
  DateTimePickerPrivate *pDVar4;
  QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
  *this_00;
  QDateTime local_40 [12];
  uint local_34;
  QDate *local_30;
  QDateTime local_28 [8];
  QDate *local_20;
  QDate *max_local;
  QDate *min_local;
  DateTimePicker *this_local;
  
  local_20 = max;
  max_local = min;
  min_local = (QDate *)this;
  bVar2 = QDate::isValid(min);
  if ((bVar2) && (bVar2 = QDate::isValid(local_20), bVar2)) {
    local_30 = (QDate *)max_local->jd;
    this_00 = &this->d;
    QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
    ::operator->(this_00);
    local_34 = QDateTime::time();
    pDVar4 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(this_00);
    QDateTime::QDateTime(local_28,local_30,(QTime *)(ulong)local_34,pDVar4->spec,0);
    pQVar1 = (QDate *)local_20->jd;
    QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
    ::operator->(this_00);
    uVar3 = QDateTime::time();
    pDVar4 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(&this->d);
    QDateTime::QDateTime(local_40,pQVar1,(QTime *)(ulong)uVar3,pDVar4->spec,0);
    setDateTimeRange(this,local_28,local_40);
    QDateTime::~QDateTime(local_40);
    QDateTime::~QDateTime(local_28);
  }
  return;
}

Assistant:

void
DateTimePicker::setDateRange( const QDate & min, const QDate & max )
{
	if( min.isValid() && max.isValid() )
		setDateTimeRange( QDateTime( min, d->minimum.time(), d->spec ),
			QDateTime( max, d->maximum.time(), d->spec ) );
}